

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

void la_miam_core_v2_data_format_json(la_vstring *vstr,void *data)

{
  byte bVar1;
  _Bool _Var2;
  char *val;
  char *key;
  char local_19;
  undefined1 local_18;
  undefined1 local_17;
  char local_16;
  undefined1 local_15;
  undefined1 local_14;
  char local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if ((ulong)*(ushort *)((long)data + 8) != 0) {
    la_json_append_int64(vstr,"err",(ulong)*(ushort *)((long)data + 8));
    return;
  }
  la_json_append_int64(vstr,"msg_num",(ulong)*(byte *)((long)data + 0x1b));
  la_json_append_bool(vstr,"ack_required",*(char *)((long)data + 0x1c) == '\x01');
  la_json_append_int64(vstr,"compression",(ulong)*(byte *)((long)data + 0x1d));
  la_json_append_int64(vstr,"encoding",(ulong)*(byte *)((long)data + 0x1e));
  la_json_append_int64(vstr,"app_type",(ulong)*(byte *)((long)data + 0x1f));
  bVar1 = *(byte *)((long)data + 0x1f);
  if (bVar1 < 0xe) {
    if ((0x20f0U >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0015655c;
    if ((7U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0015653a;
    la_json_object_start(vstr,"acars");
    local_13 = *(char *)((long)data + 0x12);
    local_12 = *(undefined1 *)((long)data + 0x13);
    local_11 = 0;
    la_json_append_string(vstr,"label",&local_13);
    if ((byte)(*(char *)((long)data + 0x1f) - 1U) < 2) {
      local_16 = *(char *)((long)data + 0x14);
      local_15 = *(undefined1 *)((long)data + 0x15);
      local_14 = 0;
      la_json_append_string(vstr,"sublabel",&local_16);
    }
    if (*(char *)((long)data + 0x1f) != '\x02') goto LAB_0015655c;
    local_19 = *(char *)((long)data + 0x16);
    val = &local_19;
    local_18 = *(undefined1 *)((long)data + 0x17);
    local_17 = 0;
    key = "mfi";
  }
  else {
LAB_0015653a:
    la_json_object_start(vstr,"non_acars");
    val = (char *)((long)data + 0x12);
    key = "app_id";
  }
  la_json_append_string(vstr,key,val);
LAB_0015655c:
  la_json_object_start(vstr,"message");
  if (*data != (uint8_t *)0x0) {
    _Var2 = is_printable(*data,*(uint32_t *)((long)data + 0xc));
    if (_Var2) {
      la_json_append_string(vstr,"text",(char *)*data);
    }
    else {
      la_json_append_octet_string(vstr,"octet_string",*data,(ulong)*(uint *)((long)data + 0xc));
    }
  }
  if (*(ushort *)((long)data + 10) != 0) {
    la_json_append_int64(vstr,"err",(ulong)*(ushort *)((long)data + 10) << 0x10);
  }
  la_json_object_end(vstr);
  la_json_object_end(vstr);
  return;
}

Assistant:

static void la_miam_core_v2_data_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);

	la_miam_core_v2_data_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "msg_num", pdu->msg_num);
	la_json_append_bool(vstr, "ack_required", pdu->ack_option == 1 ? true : false);
	la_json_append_int64(vstr, "compression", pdu->compression);
	la_json_append_int64(vstr, "encoding", pdu->encoding);
	la_json_append_int64(vstr, "app_type", pdu->app_type);

	switch(pdu->app_type) {
		case LA_MIAM_CORE_V2_APP_ACARS_2CHAR:
		case LA_MIAM_CORE_V2_APP_ACARS_4CHAR:
		case LA_MIAM_CORE_V2_APP_ACARS_6CHAR:
			la_json_object_start(vstr, "acars");
			la_json_append_string(vstr, "label",
					(char const *)(&((char[]){pdu->app_id[0], pdu->app_id[1], '\0'})));
			if(pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_4CHAR ||
					pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "sublabel",
						(char const *)(&((char[]){pdu->app_id[2], pdu->app_id[3], '\0'})));

			}
			if(pdu->app_type == LA_MIAM_CORE_V2_APP_ACARS_6CHAR) {
				la_json_append_string(vstr, "mfi",
						(char const *)(&((char[]){pdu->app_id[4], pdu->app_id[5], '\0'})));
			}
			break;
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0xd:
			// reserved for future use
			break;
		case LA_MIAM_CORE_V2_APP_NONACARS_6CHAR:
		default:    // including 0x8-0x15
			la_json_object_start(vstr, "non_acars");
			la_json_append_string(vstr, "app_id", pdu->app_id);
			break;
	}
	la_json_object_start(vstr, "message");
	if(pdu->data != NULL) {
		if(is_printable(pdu->data, pdu->data_len)) {
			la_json_append_string(vstr, "text", (char *)pdu->data);
		} else {
			la_json_append_octet_string(vstr, "octet_string",
					(uint8_t *)pdu->data, pdu->data_len);
		}
	}
	if(pdu->err & LA_MIAM_ERR_BODY) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_BODY);
	}
	la_json_object_end(vstr);   // message
	la_json_object_end(vstr);   // acars / non_acars
}